

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

void lys_disable_deviations(lys_module *module)

{
  byte bVar1;
  lys_module *module_00;
  lys_deviation *plVar2;
  char *__needle;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  long lVar8;
  long lVar9;
  unres_schema *local_50;
  unres_schema *unres;
  unres_schema *local_40;
  uint local_34;
  uint uVar7;
  
  if ((module->field_0x40 & 0x30) != 0) {
    local_50 = (unres_schema *)calloc(1,0x28);
    if (local_50 == (unres_schema *)0x0) {
      ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_disable_deviations");
      return;
    }
    uVar7 = (module->ctx->models).used;
    unres = (unres_schema *)module;
    local_40 = local_50;
    while (uVar6 = uVar7 - 1, uVar7 != 0) {
      module_00 = (module->ctx->models).list[uVar6];
      uVar7 = uVar6;
      if (module_00 != module) {
        lVar8 = (ulong)module_00->deviation_size * 0x38;
        local_34 = uVar6;
        while (lVar9 = lVar8, lVar8 = lVar9 + -0x38, uVar7 = local_34, lVar8 != -0x38) {
          plVar2 = module_00->deviation;
          __needle = module->name;
          pcVar3 = strstr(*(char **)((long)&plVar2[-1].target_name + lVar9),__needle);
          module = (lys_module *)unres;
          if ((pcVar3 != (char *)0x0) &&
             (sVar4 = strlen(__needle), module = (lys_module *)unres, pcVar3[sVar4] == ':')) {
            lys_switch_deviation
                      ((lys_deviation *)((long)&plVar2[-1].target_name + lVar9),module_00,local_40);
            module = (lys_module *)unres;
          }
        }
      }
    }
    if ((*(ushort *)&module->field_0x40 & 0x30) != 0x10) {
      __assert_fail("module->deviated == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                    ,0x1232,"void lys_disable_deviations(struct lys_module *)");
    }
    *(ushort *)&module->field_0x40 = *(ushort *)&module->field_0x40 & 0xffcf | 0x20;
    lVar8 = 0;
    for (uVar5 = 0; uVar5 < module->inc_size; uVar5 = uVar5 + 1) {
      lVar9 = *(long *)(module->inc->rev + lVar8 + -8);
      bVar1 = *(byte *)(lVar9 + 0x40);
      if ((bVar1 & 0x30) != 0) {
        *(byte *)(lVar9 + 0x40) = bVar1 & 0xcf | module->field_0x40 & 0x30;
      }
      lVar8 = lVar8 + 0x30;
    }
    if (local_40->count != 0) {
      resolve_unres_schema(module,local_40);
    }
    unres_schema_free(module,&local_50,1);
  }
  return;
}

Assistant:

void
lys_disable_deviations(struct lys_module *module)
{
    uint32_t i, j;
    const struct lys_module *mod;
    const char *ptr;
    struct unres_schema *unres;

    if (module->deviated) {
        unres = calloc(1, sizeof *unres);
        LY_CHECK_ERR_RETURN(!unres, LOGMEM(module->ctx), );

        i = module->ctx->models.used;
        while (i--) {
            mod = module->ctx->models.list[i];

            if (mod == module) {
                continue;
            }

            j = mod->deviation_size;
            while (j--) {
                ptr = strstr(mod->deviation[j].target_name, module->name);
                if (ptr && ptr[strlen(module->name)] == ':') {
                    lys_switch_deviation(&mod->deviation[j], mod, unres);
                }
            }
        }

        assert(module->deviated == 1);
        module->deviated = 2;

        for (j = 0; j < module->inc_size; j++) {
            if (module->inc[j].submodule->deviated) {
                module->inc[j].submodule->deviated = module->deviated;
            }
        }

        if (unres->count) {
            resolve_unres_schema(module, unres);
        }
        unres_schema_free(module, &unres, 1);
    }
}